

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_log.cc
# Opt level: O1

bool __thiscall
BuildLog::Restat(BuildLog *this,StringPiece path,DiskInterface *disk_interface,int output_count,
                char **outputs,string *err)

{
  _Hash_node_base _Var1;
  Metrics *this_00;
  int iVar2;
  long *plVar3;
  FILE *__stream;
  _Hash_node_base *p_Var4;
  int *piVar5;
  char *pcVar6;
  long *plVar7;
  bool bVar8;
  char *pcVar9;
  __node_base *p_Var10;
  ulong uVar11;
  string temp_path;
  ScopedMetric metrics_h_scoped;
  Metric *local_b0;
  long *local_a8;
  long local_98;
  long lStack_90;
  undefined1 *local_88;
  undefined8 local_80;
  undefined1 local_78;
  undefined7 uStack_77;
  DiskInterface *local_68;
  string local_60;
  ScopedMetric local_40;
  
  pcVar9 = path.str_;
  local_68 = disk_interface;
  if ((Restat(StringPiece,DiskInterface_const&,int,char**,std::__cxx11::string*)::metrics_h_metric
       == '\0') &&
     (iVar2 = __cxa_guard_acquire(&Restat(StringPiece,DiskInterface_const&,int,char**,std::__cxx11::string*)
                                   ::metrics_h_metric), this_00 = g_metrics, iVar2 != 0)) {
    if (g_metrics == (Metrics *)0x0) {
      local_b0 = (Metric *)0x0;
    }
    else {
      local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,".ninja_log restat","");
      local_b0 = Metrics::NewMetric(this_00,&local_60);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
    }
    Restat::metrics_h_metric = local_b0;
    __cxa_guard_release(&Restat(StringPiece,DiskInterface_const&,int,char**,std::__cxx11::string*)::
                         metrics_h_metric);
  }
  ScopedMetric::ScopedMetric(&local_40,Restat::metrics_h_metric);
  Close(this);
  local_88 = &local_78;
  if (path.len_ == 0) {
    local_80 = 0;
    local_78 = 0;
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,pcVar9,pcVar9 + path.len_);
  }
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_88);
  local_a8 = &local_98;
  plVar7 = plVar3 + 2;
  if ((long *)*plVar3 == plVar7) {
    local_98 = *plVar7;
    lStack_90 = plVar3[3];
  }
  else {
    local_98 = *plVar7;
    local_a8 = (long *)*plVar3;
  }
  *plVar3 = (long)plVar7;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if (local_88 != &local_78) {
    operator_delete(local_88,CONCAT71(uStack_77,local_78) + 1);
  }
  __stream = fopen((char *)local_a8,"wb");
  if (__stream == (FILE *)0x0) {
LAB_0010650f:
    piVar5 = __errno_location();
    pcVar6 = strerror(*piVar5);
    pcVar9 = (char *)err->_M_string_length;
    strlen(pcVar6);
    bVar8 = false;
    std::__cxx11::string::_M_replace((ulong)err,0,pcVar9,(ulong)pcVar6);
  }
  else {
    iVar2 = fprintf(__stream,"# ninja log v%d\n",5);
    if (iVar2 < 0) {
      piVar5 = __errno_location();
      pcVar6 = strerror(*piVar5);
      pcVar9 = (char *)err->_M_string_length;
      strlen(pcVar6);
      std::__cxx11::string::_M_replace((ulong)err,0,pcVar9,(ulong)pcVar6);
    }
    else {
      p_Var10 = &(this->entries_)._M_h._M_before_begin;
      do {
        p_Var10 = p_Var10->_M_nxt;
        if (p_Var10 == (__node_base *)0x0) {
          fclose(__stream);
          iVar2 = unlink(pcVar9);
          if (iVar2 < 0) goto LAB_0010650f;
          iVar2 = rename((char *)local_a8,pcVar9);
          bVar8 = true;
          if (-1 < iVar2) goto LAB_00106548;
          goto LAB_0010650f;
        }
        if (0 < output_count) {
          uVar11 = 0;
          do {
            iVar2 = std::__cxx11::string::compare((char *)p_Var10[3]._M_nxt);
            if (iVar2 == 0) goto LAB_001063ed;
            uVar11 = uVar11 + 1;
          } while ((uint)output_count != uVar11);
        }
        if (output_count < 1) {
LAB_001063ed:
          p_Var4 = (_Hash_node_base *)
                   (**(code **)(*(long *)local_68 + 0x18))(local_68,p_Var10[3]._M_nxt,err);
          if (p_Var4 == (_Hash_node_base *)0xffffffffffffffff) {
            fclose(__stream);
            bVar8 = false;
            goto LAB_00106548;
          }
          p_Var10[3]._M_nxt[6]._M_nxt = p_Var4;
        }
        _Var1._M_nxt = p_Var10[3]._M_nxt;
        iVar2 = fprintf(__stream,"%d\t%d\t%ld\t%s\t%lx\n",(ulong)*(uint *)&_Var1._M_nxt[5]._M_nxt,
                        (ulong)*(uint *)((long)&_Var1._M_nxt[5]._M_nxt + 4),_Var1._M_nxt[6]._M_nxt,
                        (_Var1._M_nxt)->_M_nxt,_Var1._M_nxt[4]._M_nxt);
      } while (0 < iVar2);
      piVar5 = __errno_location();
      pcVar6 = strerror(*piVar5);
      pcVar9 = (char *)err->_M_string_length;
      strlen(pcVar6);
      std::__cxx11::string::_M_replace((ulong)err,0,pcVar9,(ulong)pcVar6);
    }
    fclose(__stream);
    bVar8 = false;
  }
LAB_00106548:
  if (local_a8 != &local_98) {
    operator_delete(local_a8,local_98 + 1);
  }
  ScopedMetric::~ScopedMetric(&local_40);
  return bVar8;
}

Assistant:

bool BuildLog::Restat(const StringPiece path,
                      const DiskInterface& disk_interface,
                      const int output_count, char** outputs,
                      std::string* const err) {
  METRIC_RECORD(".ninja_log restat");

  Close();
  std::string temp_path = path.AsString() + ".restat";
  FILE* f = fopen(temp_path.c_str(), "wb");
  if (!f) {
    *err = strerror(errno);
    return false;
  }

  if (fprintf(f, kFileSignature, kCurrentVersion) < 0) {
    *err = strerror(errno);
    fclose(f);
    return false;
  }
  for (Entries::iterator i = entries_.begin(); i != entries_.end(); ++i) {
    bool skip = output_count > 0;
    for (int j = 0; j < output_count; ++j) {
      if (i->second->output == outputs[j]) {
        skip = false;
        break;
      }
    }
    if (!skip) {
      const TimeStamp mtime = disk_interface.Stat(i->second->output, err);
      if (mtime == -1) {
        fclose(f);
        return false;
      }
      i->second->mtime = mtime;
    }

    if (!WriteEntry(f, *i->second)) {
      *err = strerror(errno);
      fclose(f);
      return false;
    }
  }

  fclose(f);
  if (unlink(path.str_) < 0) {
    *err = strerror(errno);
    return false;
  }

  if (rename(temp_path.c_str(), path.str_) < 0) {
    *err = strerror(errno);
    return false;
  }

  return true;
}